

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O2

void duckdb_brotli::BrotliInitMemoryManager
               (MemoryManager *m,brotli_alloc_func alloc_func,brotli_free_func free_func,
               void *opaque)

{
  code *pcVar1;
  code *pcVar2;
  
  pcVar1 = alloc_func;
  pcVar2 = free_func;
  if (alloc_func == (brotli_alloc_func)0x0) {
    pcVar1 = BrotliDefaultAllocFunc;
    pcVar2 = BrotliDefaultFreeFunc;
    opaque = (void *)0x0;
  }
  m->alloc_func = pcVar1;
  m->free_func = pcVar2;
  m->opaque = opaque;
  return;
}

Assistant:

void duckdb_brotli::BrotliInitMemoryManager(
    MemoryManager* m, brotli_alloc_func alloc_func, brotli_free_func free_func,
    void* opaque) {
  if (!alloc_func) {
    m->alloc_func = duckdb_brotli::BrotliDefaultAllocFunc;
    m->free_func =  duckdb_brotli::BrotliDefaultFreeFunc;
    m->opaque = 0;
  } else {
    m->alloc_func = alloc_func;
    m->free_func = free_func;
    m->opaque = opaque;
  }
#if !defined(BROTLI_ENCODER_EXIT_ON_OOM)
  m->is_oom = BROTLI_FALSE;
  m->perm_allocated = 0;
  m->new_allocated = 0;
  m->new_freed = 0;
#endif  /* BROTLI_ENCODER_EXIT_ON_OOM */
}